

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_utilities.c
# Opt level: O1

void PrintUtilities_print_json_string(FILE *file,wchar_t *text)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t pos;
  int __c;
  ulong uVar3;
  
  if (*text != L'\0') {
    uVar3 = 0;
    pos = L'\0';
    do {
      wVar1 = text[uVar3];
      if (wVar1 < L'\r') {
        if (wVar1 == L'\t') {
          fputc(0x5c,(FILE *)file);
          __c = 0x74;
        }
        else {
          if (wVar1 != L'\n') goto LAB_0012870f;
          fputc(0x5c,(FILE *)file);
          __c = 0x6e;
        }
LAB_001286ef:
        fputc(__c,(FILE *)file);
      }
      else {
        if (wVar1 == L'\r') {
          fputc(0x5c,(FILE *)file);
          __c = 0x72;
          goto LAB_001286ef;
        }
        if ((wVar1 == L'\\') || (wVar1 == L'\"')) {
          fputc(0x5c,(FILE *)file);
          __c = (int)(char)text[uVar3];
          goto LAB_001286ef;
        }
LAB_0012870f:
        pos = UnicodeUtilities_print_wide_character_to_utf8_file(file,text,pos);
      }
      pos = pos + L'\x01';
      uVar3 = (ulong)pos;
      sVar2 = wcslen(text);
    } while (uVar3 < sVar2);
  }
  return;
}

Assistant:

void PrintUtilities_print_json_string(FILE* file, const wchar_t* text) {
    int i;
    for (i = 0; i < wcslen(text); ++i) {
        if (text[i] == L'\\' || text[i] == L'"') {
            fputc((char)'\\', file);
            fputc((char)text[i], file);
        }
        else if (text[i] == L'\n') {
            fputc((char)'\\', file);
            fputc((char)'n', file);
        }
        else if (text[i] == L'\r') {
            fputc((char)'\\', file);
            fputc((char)'r', file);
        }
        else if (text[i] == L'\t') {
            fputc((char)'\\', file);
            fputc((char)'t', file);
        }
        else {
            i = UnicodeUtilities_print_wide_character_to_utf8_file(file, text, i);
        }
    }
}